

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.cpp
# Opt level: O1

QPartialOrdering numericCompare(Private *d1,Private *d2)

{
  CompareUnderlyingType CVar1;
  _Storage<long_long,_true> _Var2;
  _Storage<long_long,_true> _Var3;
  byte bVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  byte bVar8;
  byte bVar9;
  uint uVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  _Storage<double,_true> _Var14;
  _Storage<double,_true> _Var15;
  optional<long_long> oVar16;
  optional<long_long> oVar17;
  optional<double> oVar18;
  optional<double> oVar19;
  
  uVar6 = *(ulong *)&d1->field_0x18 & 0xfffffffffffffffc;
  uVar7 = *(ulong *)&d2->field_0x18 & 0xfffffffffffffffc;
  uVar5 = *(uint *)(uVar6 + 0xc);
  uVar10 = *(uint *)(uVar7 + 0xc);
  bVar4 = 1;
  if (((((uVar5 != 1) || (uVar10 != 10)) && ((uVar5 != 10 || (uVar10 != 1)))) &&
      ((bVar4 = 6, 0x3f < uVar5 || ((0x8000004000000040U >> ((ulong)uVar5 & 0x3f) & 1) == 0)))) &&
     ((0x3f < uVar10 || ((0x8000004000000040U >> ((ulong)uVar10 & 0x3f) & 1) == 0)))) {
    bVar8 = (byte)(0x200000800000028 >> ((byte)uVar5 & 0x3f)) & uVar5 < 0x3a;
    if ((((bVar8 != 1) || (bVar4 = 5, *(uint *)(uVar6 + 4) < 5)) &&
        ((bVar9 = uVar10 < 0x3a & (byte)(0x200000800000028 >> ((byte)uVar10 & 0x3f)), bVar9 == 0 ||
         (bVar4 = 5, *(uint *)(uVar7 + 4) < 5)))) &&
       ((bVar4 = 4, *(uint *)(uVar6 + 4) < 5 && (*(uint *)(uVar7 + 4) < 5)))) {
      bVar4 = bVar8 | bVar9 | 2;
    }
  }
  if (bVar4 == 6) {
    oVar18 = anon_unknown.dwarf_96c7d3::qConvertToRealNumber(d1);
    _Var14 = oVar18.super__Optional_base<double,_true,_true>._M_payload.
             super__Optional_payload_base<double>._M_payload;
    oVar19 = anon_unknown.dwarf_96c7d3::qConvertToRealNumber(d2);
    _Var15 = oVar19.super__Optional_base<double,_true,_true>._M_payload.
             super__Optional_payload_base<double>._M_payload;
    if (((undefined1  [16])
         oVar18.super__Optional_base<double,_true,_true>._M_payload.
         super__Optional_payload_base<double> & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      return (QPartialOrdering)-0x7f;
    }
    if (((undefined1  [16])
         oVar19.super__Optional_base<double,_true,_true>._M_payload.
         super__Optional_payload_base<double> & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      return (QPartialOrdering)-0x7f;
    }
    bVar4 = 0;
    if ((_Var15._M_value <= _Var14._M_value) && (bVar4 = 0x10, _Var14._M_value <= _Var15._M_value))
    {
      bVar4 = (-(_Var14._M_value != _Var15._M_value) & 1U) << 4 | 8;
    }
    return (QPartialOrdering)(CompareUnderlyingType)(0x810100ff >> bVar4);
  }
  oVar16 = anon_unknown.dwarf_96c7d3::qConvertToNumber(d1,bVar4 == 1);
  _Var2._M_value =
       oVar16.super__Optional_base<long_long,_true,_true>._M_payload.
       super__Optional_payload_base<long_long>._M_payload;
  oVar17 = anon_unknown.dwarf_96c7d3::qConvertToNumber(d2,bVar4 == 1);
  _Var3._M_value =
       oVar17.super__Optional_base<long_long,_true,_true>._M_payload.
       super__Optional_payload_base<long_long>._M_payload;
  if (((undefined1  [16])
       oVar16.super__Optional_base<long_long,_true,_true>._M_payload.
       super__Optional_payload_base<long_long> & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    return (QPartialOrdering)-0x7f;
  }
  if (((undefined1  [16])
       oVar17.super__Optional_base<long_long,_true,_true>._M_payload.
       super__Optional_payload_base<long_long> & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    return (QPartialOrdering)-0x7f;
  }
  if (bVar4 == 5) {
    bVar11 = (ulong)_Var2 < (ulong)_Var3;
    bVar12 = _Var2._M_value == _Var3._M_value;
LAB_002d6072:
    CVar1 = -1;
    if (!bVar11) {
      CVar1 = !bVar11 && !bVar12;
    }
  }
  else {
    if (bVar4 == 4) {
      bVar13 = SBORROW8(_Var2._M_value,_Var3._M_value);
      bVar12 = _Var2._M_value - (long)_Var3 < 0;
      bVar11 = _Var2._M_value == _Var3._M_value;
    }
    else {
      uVar10 = oVar16.super__Optional_base<long_long,_true,_true>._M_payload.
               super__Optional_payload_base<long_long>._M_payload._0_4_;
      uVar5 = oVar17.super__Optional_base<long_long,_true,_true>._M_payload.
              super__Optional_payload_base<long_long>._M_payload._0_4_;
      if (bVar4 == 3) {
        bVar11 = uVar10 < uVar5;
        bVar12 = uVar10 == uVar5;
        goto LAB_002d6072;
      }
      bVar13 = SBORROW4(uVar10,uVar5);
      bVar12 = (int)(uVar10 - uVar5) < 0;
      bVar11 = uVar10 == uVar5;
    }
    CVar1 = -1;
    if (bVar13 == bVar12) {
      CVar1 = !bVar11 && bVar13 == bVar12;
    }
  }
  return (QPartialOrdering)CVar1;
}

Assistant:

static QPartialOrdering numericCompare(const QVariant::Private *d1, const QVariant::Private *d2)
{
    uint promotedType = numericTypePromotion(d1->typeInterface(), d2->typeInterface());
    if (promotedType != QMetaType::QReal)
        return integralCompare(promotedType, d1, d2);

    // floating point comparison
    const auto r1 = qConvertToRealNumber(d1);
    const auto r2 = qConvertToRealNumber(d2);
    if (!r1 || !r2)
        return QPartialOrdering::Unordered;

    return Qt::compareThreeWay(*r1, *r2);
}